

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTPNNot::gen_code(CTPNNot *this,int discard,int param_3)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  int in_stack_ffffffffffffffe8;
  uchar in_stack_ffffffffffffffef;
  
  CTPNUnary::gen_unary
            ((CTPNUnary *)CONCAT44(in_ESI,in_EDX),in_stack_ffffffffffffffef,
             in_stack_ffffffffffffffe8,0);
  return;
}

Assistant:

void CTPNNot::gen_code(int discard, int)
{
    /*
     *   Generate the subexpression and apply the NOT opcode.  Note that
     *   we can compute the subexpression as though we were applying a
     *   condition, because the NOT opcode takes exactly the same kind of
     *   input as any condition opcode; we can thus avoid an extra
     *   conversion in some cases.  
     */
    gen_unary(OPC_NOT, discard, TRUE);
}